

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatEntry.cpp
# Opt level: O0

bool __thiscall FatEntry::isCorrect(FatEntry *this)

{
  bool bVar1;
  bool bVar2;
  uchar *puVar3;
  bool local_59;
  int local_50;
  int i;
  string local_38;
  FatEntry *local_18;
  FatEntry *this_local;
  
  if (((this->attributes == '\0') || ((this->attributes & 0x10U) != 0)) ||
     ((this->attributes & 0x20U) != 0)) {
    local_18 = this;
    bVar1 = isDirectory(this);
    bVar2 = false;
    local_59 = false;
    if ((bVar1) && (local_59 = false, this->cluster == 0)) {
      getFilename_abi_cxx11_(&local_38,this);
      bVar2 = true;
      local_59 = std::operator!=(&local_38,"..");
    }
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_38);
    }
    if (local_59 == false) {
      for (local_50 = 1; local_50 < 0xb; local_50 = local_50 + 1) {
        puVar3 = (uchar *)std::__cxx11::string::operator[]((ulong)&this->data);
        bVar2 = printable(this,*puVar3);
        if (bVar2) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool FatEntry::isCorrect()
{
    if (attributes && !(attributes&FAT_ATTRIBUTES_DIR) && !(attributes&FAT_ATTRIBUTES_FILE)) {
        return false;
    }

    if (isDirectory() && cluster == 0 && getFilename()!="..") {
        return false;
    }

    for (int i=1; i<11; i++) {
        if (printable(data[i])) {
            return true;
        }
    }

    return false;
}